

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O1

AssertionResult __thiscall
anon_unknown.dwarf_24059::IsEqual
          (anon_unknown_dwarf_24059 *this,void *vec_a,void *vec_b,size_t size)

{
  int iVar1;
  AssertionResult *pAVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  ulong uVar3;
  size_t size_00;
  ulong uVar4;
  ulong uVar5;
  AssertionResult AVar6;
  ostringstream out;
  long local_200;
  long local_1f8;
  AssertionResult local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  uVar4 = 4;
  local_1f8 = 0;
  uVar5 = 0;
  local_200 = 0;
  while( true ) {
    uVar3 = uVar4;
    if (size < uVar4) {
      uVar3 = size;
    }
    if (size <= uVar5) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    size_00 = uVar3 + local_1f8;
    PrintWord((uint8_t *)((long)vec_a + uVar5),size_00,(ostream *)local_1a8);
    iVar1 = bcmp((uint8_t *)((long)vec_a + uVar5),(uint8_t *)((long)vec_b + uVar5),size_00);
    if (iVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"   ",3);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ! ",3);
      local_200 = local_200 + 1;
    }
    PrintWord((uint8_t *)((long)vec_b + uVar5),size_00,(ostream *)local_1a8);
    uVar4 = uVar4 + 4;
    local_1f8 = local_1f8 + -4;
    uVar5 = uVar5 + 4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  }
  if (local_200 == 0) {
    testing::AssertionSuccess();
  }
  else {
    testing::AssertionFailure();
    pAVar2 = testing::AssertionResult::operator<<
                       (&local_1d8,(char (*) [23])"A and B aren\'t equal:\n");
    std::__cxx11::stringbuf::str();
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_1c8);
    testing::AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1d8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  AVar6.message_.ptr_ = extraout_RDX.ptr_;
  AVar6._0_8_ = this;
  return AVar6;
}

Assistant:

::testing::AssertionResult IsEqual(const void *vec_a, const void *vec_b,
                                   size_t size) {
  std::ostringstream out;
  const uint8_t *a = reinterpret_cast<const uint8_t*>(vec_a);
  const uint8_t *b = reinterpret_cast<const uint8_t*>(vec_b);
  size_t i, errors = 0;
  for (i = 0; i < size; i += 4) {
    size_t len = 4;
    if (i + len > size)
      len = size - i;
    out << "  ";
    PrintWord(a+i, len, out);
    if (memcmp(a+i, b+i, len) == 0) {
      out << "   ";
    } else {
      out << " ! ";
      ++errors;
    }
    PrintWord(b+i, len, out);
    out << "\n";
  }
  if (!errors)
    return ::testing::AssertionSuccess();
  else
    return ::testing::AssertionFailure()
        << "A and B aren't equal:\n"
        << out.str();
}